

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

ion_boolean_t test_predicate(ion_dict_cursor_t *cursor,ion_key_t key)

{
  ion_key_size_t iVar1;
  ion_predicate_t *piVar2;
  ion_dictionary_parent_t *piVar3;
  ion_key_t pvVar4;
  char cVar5;
  char cVar6;
  bool bVar7;
  
  piVar2 = cursor->predicate;
  cVar5 = piVar2->type;
  if (cVar5 == '\x02') {
    bVar7 = true;
  }
  else {
    piVar3 = cursor->dictionary->instance;
    iVar1 = (piVar3->record).key_size;
    if (cVar5 == '\x01') {
      pvVar4 = (piVar2->statement).range.upper_bound;
      cVar5 = (*piVar3->compare)(key,(piVar2->statement).range.lower_bound,iVar1);
      cVar6 = (*piVar3->compare)(key,pvVar4,iVar1);
      bVar7 = cVar6 < '\x01' && -1 < cVar5;
    }
    else if (cVar5 == '\0') {
      cVar5 = (*piVar3->compare)(key,(piVar2->statement).range.lower_bound,iVar1);
      bVar7 = cVar5 == '\0';
    }
    else {
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

ion_boolean_t
test_predicate(
	ion_dict_cursor_t	*cursor,
	ion_key_t			key
) {
	ion_dictionary_parent_t *parent		= cursor->dictionary->instance;
	ion_key_size_t			key_size	= cursor->dictionary->instance->record.key_size;
	ion_boolean_t			result		= boolean_false;

	switch (cursor->predicate->type) {
		case predicate_equality: {
			if (parent->compare(key, cursor->predicate->statement.equality.equality_value, cursor->dictionary->instance->record.key_size) == 0) {
				result = boolean_true;
			}

			break;
		}

		case predicate_range: {
			ion_key_t	lower_b			= cursor->predicate->statement.range.lower_bound;
			ion_key_t	upper_b			= cursor->predicate->statement.range.upper_bound;

			/* Check if key >= lower bound */
			ion_boolean_t comp_lower	= parent->compare(key, lower_b, key_size) >= 0;

			/* Check if key <= upper bound */
			ion_boolean_t comp_upper	= parent->compare(key, upper_b, key_size) <= 0;

			result = comp_lower && comp_upper;
			break;
		}

		case predicate_all_records: {
			result = boolean_true;
			break;
		}
	}

	return result;
}